

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int target_data_begin(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                     int64_t *arg_sizes,int64_t *arg_types)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  void *HstPtrBegin_00;
  bool *Size;
  void *pvVar4;
  DeviceTy *pDVar5;
  mapped_type *pmVar6;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int rt_1;
  void *TgtPtrBase_1;
  uint64_t Delta_1;
  int rt;
  long parent_rc;
  int32_t parent_idx;
  bool copy;
  void *TgtPtrBase;
  uintptr_t Delta;
  void *TgtPtrBegin;
  bool UpdateRef;
  bool IsImplicit;
  bool Pointer_IsNew;
  bool IsNew;
  void *Pointer_TgtPtrBegin;
  void *Pointer_HstPtrBegin;
  int next_i;
  int64_t padding;
  int64_t data_size;
  void *HstPtrBase;
  void *HstPtrBegin;
  int32_t i;
  undefined4 in_stack_ffffffffffffff1c;
  mutex *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  DeviceTy *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  key_type *in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint uVar7;
  byte local_7c;
  byte local_79;
  void *local_78;
  undefined2 uVar8;
  bool *IsNew_00;
  mutex *HstPtrBase_00;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar9;
  
  iVar9 = 0;
  do {
    if (in_ESI <= iVar9) {
      return 0;
    }
    pDVar5 = in_stack_ffffffffffffff30;
    if (((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0x100) == 0) &&
       ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0x80) == 0)) {
      HstPtrBegin_00 = *(void **)(in_RCX + (long)iVar9 * 8);
      HstPtrBase_00 = *(mutex **)(in_RDX + (long)iVar9 * 8);
      Size = *(bool **)(in_R8 + (long)iVar9 * 8);
      IsNew_00 = (bool *)0x0;
      iVar1 = iVar9 + 1;
      iVar2 = member_of(*(int64_t *)(in_R9 + (long)iVar9 * 8));
      uVar7 = in_stack_ffffffffffffff64;
      if ((iVar2 < 0) &&
         (((iVar1 < in_ESI &&
           (iVar2 = member_of(*(int64_t *)(in_R9 + (long)iVar1 * 8)),
           uVar7 = in_stack_ffffffffffffff64, iVar2 == iVar9)) &&
          (IsNew_00 = (bool *)((long)HstPtrBegin_00 % 8), IsNew_00 != (bool *)0x0)))) {
        HstPtrBegin_00 = (void *)((long)HstPtrBegin_00 - (long)IsNew_00);
        Size = IsNew_00 + (long)Size;
      }
      uVar8 = (undefined2)((uint)iVar1 >> 0x10);
      local_7c = ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0xffff000000000000) != 0 ^ 0xffU) & 1;
      if ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0x10) != 0) {
        local_78 = DeviceTy::getOrAllocTgtPtr
                             ((DeviceTy *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),HstPtrBegin_00,
                              HstPtrBase_00,(int64_t)Size,IsNew_00,SUB41((uint)iVar1 >> 0x18,0),
                              SUB41((uint)iVar1 >> 0x10,0));
        if (local_78 == (void *)0x0) {
          return -1;
        }
        HstPtrBase_00 = (mutex *)(HstPtrBase_00->super___mutex_base)._M_mutex.__align;
        local_7c = 1;
      }
      uVar3 = (uint)local_7c;
      pvVar4 = DeviceTy::getOrAllocTgtPtr
                         ((DeviceTy *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),HstPtrBegin_00,
                          HstPtrBase_00,(int64_t)Size,IsNew_00,SUB21((ushort)uVar8 >> 8,0),
                          SUB21(uVar8,0));
      if ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0x40) != 0) {
        *(long *)(in_RDX + (long)iVar9 * 8) =
             (long)pvVar4 - ((long)HstPtrBegin_00 - (long)HstPtrBase_00);
      }
      in_stack_ffffffffffffff64 = uVar7;
      if ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 1) != 0) {
        in_stack_ffffffffffffff64 = uVar7 & 0xffffff;
        if (((local_79 & 1) == 0) && ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 4) == 0)) {
          if ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0xffff000000000000) != 0) {
            in_stack_ffffffffffffff60 = member_of(*(int64_t *)(in_R9 + (long)iVar9 * 8));
            in_stack_ffffffffffffff58 =
                 (key_type *)
                 DeviceTy::getMapEntryRefCnt
                           ((DeviceTy *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
            if (in_stack_ffffffffffffff58 == (key_type *)0x1) {
              in_stack_ffffffffffffff64 = CONCAT13(1,(int3)in_stack_ffffffffffffff64);
            }
          }
        }
        else {
          in_stack_ffffffffffffff64 = CONCAT13(1,(int3)uVar7);
        }
        if ((in_stack_ffffffffffffff64 & 0x1000000) != 0) {
          iVar2 = DeviceTy::data_submit
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,uVar3));
          if (iVar2 != 0) {
            return -1;
          }
          in_stack_ffffffffffffff54 = 0;
        }
      }
      pDVar5 = in_stack_ffffffffffffff30;
      if ((*(ulong *)(in_R9 + (long)iVar9 * 8) & 0x10) != 0) {
        in_stack_ffffffffffffff48 = (void *)((long)HstPtrBegin_00 - (long)HstPtrBase_00);
        pDVar5 = (DeviceTy *)((long)pvVar4 - (long)in_stack_ffffffffffffff48);
        iVar2 = DeviceTy::data_submit
                          (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,uVar3));
        if (iVar2 != 0) {
          return -1;
        }
        std::mutex::lock(in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff20 = HstPtrBase_00;
        in_stack_ffffffffffffff28 = local_78;
        pmVar6 = std::
                 map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                 ::operator[]((map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff58);
        pmVar6->HstPtrVal = in_stack_ffffffffffffff20;
        pmVar6->TgtPtrAddr = in_stack_ffffffffffffff28;
        pmVar6->TgtPtrVal = pDVar5;
        std::mutex::unlock((mutex *)0x114587);
      }
    }
    iVar9 = iVar9 + 1;
    in_stack_ffffffffffffff30 = pDVar5;
  } while( true );
}

Assistant:

int target_data_begin(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    // Ignore private variables and arrays - there is no mapping for them.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    void *HstPtrBase = args_base[i];
    int64_t data_size = arg_sizes[i];

    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    // Address of pointer on the host and device, respectively.
    void *Pointer_HstPtrBegin, *Pointer_TgtPtrBegin;
    bool IsNew, Pointer_IsNew;
    bool IsImplicit = arg_types[i] & OMP_TGT_MAPTYPE_IMPLICIT;
    // UpdateRef is based on MEMBER_OF instead of TARGET_PARAM because if we
    // have reached this point via __tgt_target_data_begin and not __tgt_target
    // then no argument is marked as TARGET_PARAM ("omp target data map" is not
    // associated with a target region, so there are no target parameters). This
    // may be considered a hack, we could revise the scheme in the future.
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF);
    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Has a pointer entry: \n");
      // base is address of pointer.
      Pointer_TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBase, HstPtrBase,
          sizeof(void *), Pointer_IsNew, IsImplicit, UpdateRef);
      if (!Pointer_TgtPtrBegin) {
        DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
            "illegal mapping).\n");
        return OFFLOAD_FAIL;
      }
      DP("There are %zu bytes allocated at target address " DPxMOD " - is%s new"
          "\n", sizeof(void *), DPxPTR(Pointer_TgtPtrBegin),
          (Pointer_IsNew ? "" : " not"));
      Pointer_HstPtrBegin = HstPtrBase;
      // modify current entry.
      HstPtrBase = *(void **)HstPtrBase;
      UpdateRef = true; // subsequently update ref count of pointee
    }

    void *TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBegin, HstPtrBase,
        data_size, IsNew, IsImplicit, UpdateRef);
    if (!TgtPtrBegin && data_size) {
      // If data_size==0, then the argument could be a zero-length pointer to
      // NULL, so getOrAlloc() returning NULL is not an error.
      DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
          "illegal mapping).\n");
    }
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s new\n", data_size, DPxPTR(TgtPtrBegin),
        (IsNew ? "" : " not"));

    if (arg_types[i] & OMP_TGT_MAPTYPE_RETURN_PARAM) {
      uintptr_t Delta = (uintptr_t)HstPtrBegin - (uintptr_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uintptr_t)TgtPtrBegin - Delta);
      DP("Returning device pointer " DPxMOD "\n", DPxPTR(TgtPtrBase));
      args_base[i] = TgtPtrBase;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      bool copy = false;
      if (IsNew || (arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS)) {
        copy = true;
      } else if (arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) {
        // Copy data only if the "parent" struct has RefCount==1.
        int32_t parent_idx = member_of(arg_types[i]);
        long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
        assert(parent_rc > 0 && "parent struct not found");
        if (parent_rc == 1) {
          copy = true;
        }
      }

      if (copy) {
        DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
            data_size, DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
        int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, data_size);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Update pointer (" DPxMOD ") -> [" DPxMOD "]\n",
          DPxPTR(Pointer_TgtPtrBegin), DPxPTR(TgtPtrBegin));
      uint64_t Delta = (uint64_t)HstPtrBegin - (uint64_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uint64_t)TgtPtrBegin - Delta);
      int rt = Device.data_submit(Pointer_TgtPtrBegin, &TgtPtrBase,
          sizeof(void *));
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      // create shadow pointers for this entry
      Device.ShadowMtx.lock();
      Device.ShadowPtrMap[Pointer_HstPtrBegin] = {HstPtrBase,
          Pointer_TgtPtrBegin, TgtPtrBase};
      Device.ShadowMtx.unlock();
    }
  }

  return OFFLOAD_SUCCESS;
}